

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::matchSymbol(MipsParser *this,Parser *parser,char symbol)

{
  bool bVar1;
  TokenType type;
  int iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = (int)CONCAT71(in_register_00000011,symbol);
  if (iVar2 == 0x28) {
    type = LParen;
  }
  else if (iVar2 == 0x2c) {
    type = Comma;
  }
  else {
    if (iVar2 != 0x29) {
      return false;
    }
    type = RParen;
  }
  bVar1 = Parser::matchToken(parser,type,false);
  return bVar1;
}

Assistant:

bool MipsParser::matchSymbol(Parser& parser, char symbol)
{
	switch (symbol)
	{
	case '(':
		return parser.matchToken(TokenType::LParen);
	case ')':
		return parser.matchToken(TokenType::RParen);
	case ',':
		return parser.matchToken(TokenType::Comma);
	}

	return false;
}